

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NFA.cpp
# Opt level: O3

double __thiscall NFALUT::nfa(NFALUT *this,int n,int k)

{
  int iVar1;
  ulong uVar2;
  int iVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  
  if (n < k || (k | n) < 0) {
    return -1.0;
  }
  dVar4 = this->prob;
  if (dVar4 <= 0.0) {
    return -1.0;
  }
  if (1.0 <= dVar4) {
    return -1.0;
  }
  if (n == 0 || k == 0) {
LAB_00119ead:
    dVar10 = -this->logNT;
  }
  else {
    if (n - k == 0) {
      dVar10 = this->logNT;
      dVar4 = log10(dVar4);
      return dVar4 * -(double)k - dVar10;
    }
    dVar10 = (double)n + 1.0;
    if (dVar10 <= 15.0) {
      dVar10 = log_gamma_lanczos(dVar10);
    }
    else {
      dVar10 = log_gamma_windschitl(dVar10);
    }
    dVar11 = (double)k;
    dVar5 = dVar11 + 1.0;
    if (dVar5 <= 15.0) {
      dVar5 = log_gamma_lanczos(dVar5);
    }
    else {
      dVar5 = log_gamma_windschitl(dVar5);
    }
    dVar9 = (double)(n - k);
    dVar6 = dVar9 + 1.0;
    if (dVar6 <= 15.0) {
      dVar6 = log_gamma_lanczos(dVar6);
    }
    else {
      dVar6 = log_gamma_windschitl(dVar6);
    }
    dVar7 = log(this->prob);
    dVar8 = log(1.0 - this->prob);
    dVar10 = dVar9 * dVar8 + dVar7 * dVar11 + ((dVar10 - dVar5) - dVar6);
    dVar5 = exp(dVar10);
    if ((dVar5 != 0.0) || (NAN(dVar5))) {
      dVar9 = ABS(dVar5);
      dVar6 = dVar9;
      if (dVar9 <= 0.0) {
        dVar6 = 0.0;
      }
      dVar7 = 2.2250738585072014e-308;
      if (2.2250738585072014e-308 <= dVar6) {
        dVar7 = dVar6;
      }
      if (dVar9 / dVar7 <= 2.220446049250313e-14) goto LAB_0011a1ab;
      iVar3 = n - k;
      dVar10 = dVar5;
      if (iVar3 != 0 && k <= n) {
        uVar2 = (ulong)(uint)k;
        do {
          iVar1 = (int)uVar2;
          if (iVar1 < 99999) {
            dVar11 = nfa::inv[uVar2 + 1];
            if ((dVar11 == 0.0) && (!NAN(dVar11))) {
              dVar11 = 1.0 / (double)(iVar1 + 1);
              nfa::inv[uVar2 + 1] = dVar11;
            }
          }
          else {
            dVar11 = 1.0 / (double)(iVar1 + 1);
          }
          dVar11 = dVar11 * (double)iVar3;
          dVar9 = (dVar4 / (1.0 - dVar4)) * dVar11;
          dVar5 = dVar5 * dVar9;
          dVar10 = dVar10 + dVar5;
          if (dVar11 < 1.0) {
            dVar11 = pow(dVar9,(double)iVar3);
            dVar6 = log10(dVar10);
            if (((1.0 - dVar11) / (1.0 - dVar9) + -1.0) * dVar5 <
                ABS(-dVar6 - this->logNT) * 0.1 * dVar10) break;
          }
          if (n <= iVar1 + 1) break;
          iVar3 = iVar3 + -1;
          uVar2 = uVar2 + 1;
        } while( true );
      }
      dVar10 = log10(dVar10);
      dVar10 = -dVar10;
    }
    else {
LAB_0011a1ab:
      if (dVar11 <= (double)n * this->prob) goto LAB_00119ead;
      dVar10 = dVar10 / -2.302585092994046;
    }
    dVar10 = dVar10 - this->logNT;
  }
  return dVar10;
}

Assistant:

double NFALUT::nfa(int n, int k)
{
	static double inv[TABSIZE];   /* table to keep computed inverse values */
	double tolerance = 0.1;       /* an error of 10% in the result is accepted */
	double log1term, term, bin_term, mult_term, bin_tail, err, p_term;
	int i;

	/* check parameters */
	if (n<0 || k<0 || k>n || prob <= 0.0 || prob >= 1.0) return -1.0;

	/* trivial cases */
	if (n == 0 || k == 0) return -logNT;
	if (n == k) return -logNT - (double)n * log10(prob);

	/* probability term */
	p_term = prob / (1.0 - prob);

	/* compute the first term of the series */
	/*
	binomial_tail(n,k,p) = sum_{i=k}^n bincoef(n,i) * p^i * (1-p)^{n-i}
	where bincoef(n,i) are the binomial coefficients.
	But
	bincoef(n,k) = gamma(n+1) / ( gamma(k+1) * gamma(n-k+1) ).
	We use this to compute the first term. Actually the log of it.
	*/
	log1term = log_gamma((double)n + 1.0) - log_gamma((double)k + 1.0)
		- log_gamma((double)(n - k) + 1.0)
		+ (double)k * log(prob) + (double)(n - k) * log(1.0 - prob);
	term = exp(log1term);

	/* in some cases no more computations are needed */
	if (double_equal(term, 0.0)) {              /* the first term is almost zero */
		if ((double)k > (double)n * prob)     /* at begin or end of the tail?  */
			return -log1term / M_LN10 - logNT;  /* end: use just the first term  */
		else
			return -logNT;                      /* begin: the tail is roughly 1  */
	} //end-if

	  /* compute more terms if needed */
	bin_tail = term;
	for (i = k + 1; i <= n; i++) {
		/*
		As
		term_i = bincoef(n,i) * p^i * (1-p)^(n-i)
		and
		bincoef(n,i)/bincoef(n,i-1) = n-1+1 / i,
		then,
		term_i / term_i-1 = (n-i+1)/i * p/(1-p)
		and
		term_i = term_i-1 * (n-i+1)/i * p/(1-p).
		1/i is stored in a table as they are computed,
		because divisions are expensive.
		p/(1-p) is computed only once and stored in 'p_term'.
		*/
		bin_term = (double)(n - i + 1) * (i<TABSIZE ?
			(inv[i] != 0.0 ? inv[i] : (inv[i] = 1.0 / (double)i)) :
			1.0 / (double)i);

		mult_term = bin_term * p_term;
		term *= mult_term;
		bin_tail += term;

		if (bin_term<1.0) {
			/* When bin_term<1 then mult_term_j<mult_term_i for j>i.
			Then, the error on the binomial tail when truncated at
			the i term can be bounded by a geometric series of form
			term_i * sum mult_term_i^j.                            */
			err = term * ((1.0 - pow(mult_term, (double)(n - i + 1))) /
				(1.0 - mult_term) - 1.0);

			/* One wants an error at most of tolerance*final_result, or:
			tolerance * abs(-log10(bin_tail)-logNT).
			Now, the error that can be accepted on bin_tail is
			given by tolerance*final_result divided by the derivative
			of -log10(x) when x=bin_tail. that is:
			tolerance * abs(-log10(bin_tail)-logNT) / (1/bin_tail)
			Finally, we truncate the tail if the error is less than:
			tolerance * abs(-log10(bin_tail)-logNT) * bin_tail        */
			if (err < tolerance * fabs(-log10(bin_tail) - logNT) * bin_tail) break;
		} //end-if
	} //end-for

	return -log10(bin_tail) - logNT;
}